

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

ssize_t __thiscall directory::read(directory *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t *puVar1;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  allocator_type local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  std::istream::seekg(pcVar3,0,0);
  std::istream::read(pcVar3,(long)this);
  puVar1 = &this->bucket_size;
  std::istream::read(pcVar3,(long)puVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_40,(ulong)this->bucket_size,&local_41);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->bucket_ids,&local_40);
  uVar2 = extraout_RAX;
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    uVar2 = extraout_RAX_00;
  }
  if (*puVar1 != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      std::istream::read(pcVar3,(long)(this->bucket_ids).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
      uVar5 = uVar5 + 1;
      uVar2 = (ulong)*puVar1;
      lVar4 = lVar4 + 4;
    } while (uVar5 < uVar2);
  }
  return uVar2;
}

Assistant:

void directory::read(std::fstream &stream) {
    stream.seekg(0);

    stream.read((char *) &depth, DEPTHS);
    stream.read((char *) &bucket_size, BUCKET_SIZE);
    this->bucket_ids = vector<uint32_t>(bucket_size);

    for (int i = 0; i < bucket_size; ++i) {
        stream.read((char *) &bucket_ids[i], BUCKET_ID);
    }
}